

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FundamentalOperationalData *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  FundamentalOperationalData *local_18;
  FundamentalOperationalData *this_local;
  
  local_18 = this;
  this_local = (FundamentalOperationalData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"FundamentalOperationalData:");
  std::operator<<(poVar1,"\tNOT IMPLEMENTED YET\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString FundamentalOperationalData::GetAsString() const
{
    KStringStream ss;

    ss << "FundamentalOperationalData:"
       << "\tNOT IMPLEMENTED YET\n";

    // TODO: Get string for a specific system type.

    return ss.str();
}